

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
     scan(TypeUpdater *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  ulong uVar29;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,&pMVar25->size);
    goto LAB_009cffe8;
  case LoopId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_009cfbc1;
  case BreakId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,&pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_009cfabb;
  case SwitchId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_009cfabb;
  case CallId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pCVar13->target);
    uVar29 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_009cfe19;
  case GlobalGetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitGlobalSet,currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_009cfbc1;
  case LoadId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_009d0000;
  case StoreId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_009cfde0;
  case ConstId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_009cfe19;
  case BinaryId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_009cfd82;
  case SelectId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_009cffd9;
  case DropId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_009cfc52;
  case ReturnId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_009cfabb;
  case MemorySizeId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitMemoryGrow,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_009cfc52;
  case NopId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitAtomicRMW,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_009cfe60;
  case AtomicCmpxchgId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitAtomicCmpxchg,currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_009cfe51;
  case AtomicWaitId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitAtomicWait,currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_009cfbe1;
  case AtomicNotifyId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitAtomicNotify,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_009cfd82;
  case AtomicFenceId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDExtract,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_009cfe19;
  case SIMDReplaceId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDReplace,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_009cfd90;
  case SIMDShuffleId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDShuffle,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_009cffe8;
  case SIMDTernaryId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDTernary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_009cfbe1;
  case SIMDShiftId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDShift,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_009cfd82;
  case SIMDLoadId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_009cfd1c;
  case SIMDLoadStoreLaneId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_009cfde0:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_009d0000;
  case MemoryInitId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitMemoryInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_009cfe51;
  case DataDropId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_009cffd9;
  case MemoryFillId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitMemoryFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_009cffd9;
  case PopId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefIsNull,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_009cfc52;
  case RefFuncId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_009cffe8;
  case TableGetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_009cfbc1:
    ppEVar4 = &pGVar8->value;
    goto LAB_009d0000;
  case TableSetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_009cfe60;
  case TableSizeId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableGrow,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_009cfe60;
  case TableFillId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableFill,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_009cfe51;
  case TableCopyId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_009cffd9;
  case TableInitId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTableInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_009cfe51;
  case TryId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_009d0000;
  case TryTableId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_009cfc52;
  case ThrowId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_009cfc52;
  case TupleMakeId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTupleMake,currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitTupleExtract,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_009cfc52;
  case RefI31Id:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_009cfc52;
  case I31GetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_009cfc52;
  case CallRefId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pCVar9->target);
    uVar29 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_009cfc52;
  case RefCastId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_009cfc52;
  case BrOnId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_009cfd1c:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_009d0000;
  case StructNewId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStructNew,currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStructGet,currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_009cfe19;
  case StructSetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStructSet,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_009cfd82;
  case StructRMWId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStructRMW,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_009cfd82;
  case StructCmpxchgId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStructCmpxchg,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_009cfbe1:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pAVar5->timeout);
LAB_009cfbfa:
    ppEVar4 = &pAVar5->expected;
    goto LAB_009cfd90;
  case ArrayNewId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_009cfabb:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayNewData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_009cfe60;
  case ArrayNewElemId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayNewElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_009cfe60;
  case ArrayNewFixedId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayNewFixed,currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_009cffe8;
  case ArraySetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_009cffd9;
  case ArrayLenId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_009cfc52;
  case ArrayCopyId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,(Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_009cffca;
  case ArrayFillId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_009cffca:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,(Expression **)&pMVar25->destMemory);
    goto LAB_009cffd9;
  case ArrayInitDataId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayInitData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_009cf727;
  case ArrayInitElemId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitArrayInitElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_009cf727:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,(Expression **)&pAVar12->memory);
LAB_009cfe51:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pAVar12->replacement);
LAB_009cfe60:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_009d0000;
  case RefAsId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_009cfe19;
  case StringNewId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringNew,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,&pAVar5->timeout);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,&pAVar5->expected);
    goto LAB_009cfd9b;
  case StringConstId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringMeasure,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_009cfe19:
    ppEVar4 = &pSVar10->ref;
    goto LAB_009d0000;
  case StringEncodeId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringEncode,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::
    maybePushTask((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                   *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ::scan,&pAVar5->timeout);
    goto LAB_009cfbfa;
  case StringConcatId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringConcat,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_009cffe8;
  case StringEqId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringEq,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_009cfd82:
    ppEVar4 = &pAVar5->expected;
LAB_009cfd90:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,ppEVar4);
LAB_009cfd9b:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_009d0000;
  case StringWTF16GetId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringWTF16Get,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_009cffe8;
  case StringSliceWTFId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStringSliceWTF,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_009cffd9:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pMVar25->size);
LAB_009cffe8:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_009d0000;
  case ContNewId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_009cfc52:
    ppEVar4 = &pTVar7->body;
LAB_009d0000:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,ppEVar4);
    return;
  case ContBindId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pCVar6->cont);
    uVar29 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pRVar2->cont);
    uVar29 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitResumeThrow,currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pRVar26->cont);
    uVar29 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
              ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                       ::scan,&pSVar3->cont);
    uVar29 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>::pushTask
                ((Walker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                  *)self,ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                         ::scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }